

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

void __thiscall t_xml_generator::write_element_end(t_xml_generator *this)

{
  int *piVar1;
  ostream *poVar2;
  _Elt_pointer pbVar3;
  string local_38;
  
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  if ((this->top_element_is_empty == true) && (this->top_element_is_open == true)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_xml_," />",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->f_xml_,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_38,&this->super_t_generator);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_xml_,local_38._M_dataplus._M_p,local_38._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</",2);
    pbVar3 = (this->elements_).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == (this->elements_).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar3 = (this->elements_).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,pbVar3[-1]._M_dataplus._M_p,pbVar3[-1]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  this->top_element_is_empty = false;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&(this->elements_).c);
  return;
}

Assistant:

void t_xml_generator::write_element_end() {
  indent_down();
  if (top_element_is_empty && top_element_is_open) {
    f_xml_ << " />" << endl;
  } else {
    f_xml_ << indent() << "</" << elements_.top() << ">" << endl;
  }
  top_element_is_empty = false;
  elements_.pop();
}